

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

void __thiscall soul::heart::Parser::scanInput(Parser *this,ScannedTopLevelItem *item)

{
  iterator __position;
  Module *pMVar1;
  SourceCodeText *o;
  bool bVar2;
  InputDeclaration *pIVar3;
  Identifier name;
  int line;
  char *location;
  char *message;
  Identifier *in_R9;
  CodeLocation errorLocation;
  CodeLocation local_68;
  pool_ref<soul::heart::InputDeclaration> local_58;
  CompileMessage local_50;
  
  local_68.sourceCode.object =
       (SourceCodeText *)
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  __position._M_current =
       (item->inputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (item->inputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::
    _M_realloc_insert<soul::UTF8Reader>(&item->inputDecls,__position,(UTF8Reader *)&local_68);
  }
  else {
    (__position._M_current)->data = (char *)local_68.sourceCode.object;
    (item->inputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  pMVar1 = (this->module).object;
  if (pMVar1 == (Module *)0x0) {
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  pIVar3 = PoolAllocator::allocate<soul::heart::InputDeclaration,soul::CodeLocation&>
                     (&pMVar1->allocator->pool,
                      &(this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ).location);
  name = parseGeneralIdentifier(this);
  (pIVar3->super_IODeclaration).name.name = name.name;
  o = (this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      ).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  local_68.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  local_68.sourceCode.object = o;
  if (name.name == (string *)0x0) {
    line = 0x21;
    location = "operator const std::basic_string<char> &";
    message = "isValid()";
  }
  else {
    bVar2 = isReservedFunctionName(name.name);
    if (bVar2) {
      CompileMessageHelpers::createMessage<soul::Identifier&>
                (&local_50,(CompileMessageHelpers *)0x1,none,0x2a1fd9,
                 (char *)&(pIVar3->super_IODeclaration).name,in_R9);
      CodeLocation::throwError(&local_68,&local_50);
    }
    pMVar1 = (this->module).object;
    if (pMVar1 != (Module *)0x0) {
      (pIVar3->super_IODeclaration).index =
           (uint32_t)
           ((ulong)((long)(pMVar1->inputs).
                          super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pMVar1->inputs).
                         super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3);
      local_58.object = pIVar3;
      std::
      vector<soul::pool_ref<soul::heart::InputDeclaration>,std::allocator<soul::pool_ref<soul::heart::InputDeclaration>>>
      ::emplace_back<soul::pool_ref<soul::heart::InputDeclaration>>
                ((vector<soul::pool_ref<soul::heart::InputDeclaration>,std::allocator<soul::pool_ref<soul::heart::InputDeclaration>>>
                  *)&pMVar1->inputs,&local_58);
      skipPastNextOccurrenceOf(this,(TokenType)0x27ca5c);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
      return;
    }
    line = 0x3c;
    location = "operator->";
    message = "object != nullptr";
  }
  throwInternalCompilerError(message,location,line);
}

Assistant:

void scanInput (ScannedTopLevelItem& item)
    {
        item.inputDecls.push_back (getCurrentTokeniserPosition());
        auto& inputDeclaration = module->allocate<heart::InputDeclaration> (location);
        inputDeclaration.name = parseGeneralIdentifier();

        auto errorLocation = location;
        if (isReservedFunctionName (inputDeclaration.name))
            errorLocation.throwError (Errors::invalidEndpointName (inputDeclaration.name));

        inputDeclaration.index = (uint32_t) module->inputs.size();

        module->inputs.push_back (inputDeclaration);
        skipPastNextOccurrenceOf (HEARTOperator::semicolon);
    }